

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::MergeFrom
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *from)

{
  ulong uVar1;
  LogMessage *other;
  NetworkUpdateParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe20f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(from->preprocessing_).super_RepeatedPtrFieldBase);
  uVar3 = (ulong)(from->labelprobabilitylayername_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->labelprobabilitylayername_,uVar3,puVar2);
  }
  puVar4 = (undefined1 *)from->updateparams_;
  if ((NetworkUpdateParameters *)puVar4 != (NetworkUpdateParameters *)0x0 &&
      from != (NeuralNetworkClassifier *)_NeuralNetworkClassifier_default_instance_) {
    this_00 = this->updateparams_;
    if (this_00 == (NetworkUpdateParameters *)0x0) {
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar5);
      this->updateparams_ = this_00;
      puVar4 = (undefined1 *)from->updateparams_;
    }
    if ((NetworkUpdateParameters *)puVar4 == (NetworkUpdateParameters *)0x0) {
      puVar4 = _NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this_00,(NetworkUpdateParameters *)puVar4);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  if (from->_oneof_case_[0] != 0x65) {
    if (from->_oneof_case_[0] != 100) goto LAB_002a016d;
    if (this->_oneof_case_[0] == 100) {
      this_01 = (this->ClassLabels_).stringclasslabels_;
LAB_002a0116:
      puVar4 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                          (pAVar5);
      (this->ClassLabels_).stringclasslabels_ = this_01;
      if (from->_oneof_case_[0] == 100) goto LAB_002a0116;
      puVar4 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar4);
    goto LAB_002a016d;
  }
  if (this->_oneof_case_[0] == 0x65) {
    this_02 = (this->ClassLabels_).int64classlabels_;
LAB_002a014d:
    puVar4 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar5);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[0] == 0x65) goto LAB_002a014d;
    puVar4 = _Int64Vector_default_instance_;
  }
  Int64Vector::MergeFrom(this_02,(Int64Vector *)puVar4);
LAB_002a016d:
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::MergeFrom(const NeuralNetworkClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (!from._internal_labelprobabilitylayername().empty()) {
    _internal_set_labelprobabilitylayername(from._internal_labelprobabilitylayername());
  }
  if (from._internal_has_updateparams()) {
    _internal_mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from._internal_updateparams());
  }
  if (from._internal_arrayinputshapemapping() != 0) {
    _internal_set_arrayinputshapemapping(from._internal_arrayinputshapemapping());
  }
  if (from._internal_imageinputshapemapping() != 0) {
    _internal_set_imageinputshapemapping(from._internal_imageinputshapemapping());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}